

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  __pid_t _Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  __pid_t _Var11;
  int *piVar12;
  char *pcVar13;
  uint *puVar14;
  ssize_t sVar15;
  byte *__s2;
  size_t sVar16;
  char *pcVar17;
  size_t sVar18;
  FILE *pFVar19;
  char *pcVar20;
  size_t sVar21;
  ssize_t sVar22;
  socklen_t __len;
  uint uVar23;
  ulong uVar24;
  undefined1 *puVar25;
  char *pcVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  unsigned_short uStack_24c82;
  size_t count;
  char *cmd;
  int prot_minor;
  int rtp_size;
  int num;
  unsigned_long uStack_24c58;
  size_t cmdsize;
  __pid_t _Stack_24c48;
  int rtp_channel;
  int prot_major;
  int iStack_24c34;
  int flag;
  int rtp_partno;
  char *pcStack_24c28;
  char *pcStack_24c20;
  int iStack_24c14;
  undefined1 *puStack_24c10;
  ulong uStack_24c08;
  ulong uStack_24c00;
  char *endptr;
  undefined8 uStack_24bf0;
  undefined8 uStack_24be8;
  undefined8 uStack_24be0;
  undefined8 uStack_24bd8;
  undefined8 uStack_24bd0;
  undefined8 uStack_24bc8;
  undefined8 uStack_24bc0;
  undefined8 uStack_24bb8;
  undefined8 uStack_24bb0;
  sockaddr sStack_24af8;
  undefined4 uStack_24ae8;
  undefined4 uStack_24ae4;
  undefined4 uStack_24ae0;
  undefined1 auStack_24a84 [4];
  undefined4 uStack_24a80;
  undefined1 local_91;
  char *local_90;
  ulong uStack_88;
  ulong local_80;
  undefined1 *local_78;
  undefined2 local_70;
  char local_6e;
  undefined1 *local_68;
  undefined2 local_60;
  undefined8 local_5c;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  byte bStack_48;
  undefined1 *local_40;
  size_t sStack_38;
  
  memset(&uStack_24a80,0,0x24a50);
  if (argc < 2) {
    pcStack_24c20 = ".rtsp.pid";
    uStack_24c82 = 8999;
  }
  else {
    uStack_24c82 = 8999;
    pcStack_24c20 = ".rtsp.pid";
    iVar8 = 1;
    do {
      pcVar13 = argv[iVar8];
      iVar6 = strcmp("--version",pcVar13);
      if (iVar6 == 0) {
        curl_mprintf("rtspd IPv4%s\n","/IPv6");
        return 0;
      }
      iVar6 = strcmp("--pidfile",pcVar13);
      if (iVar6 == 0) {
        iVar6 = iVar8 + 1;
        if (iVar6 < argc) {
          pcStack_24c20 = argv[iVar6];
          iVar6 = iVar8 + 2;
        }
      }
      else {
        iVar6 = strcmp("--logfile",pcVar13);
        if (iVar6 == 0) {
          iVar6 = iVar8 + 1;
          if (iVar6 < argc) {
            serverlogfile = argv[iVar6];
            iVar6 = iVar8 + 2;
          }
        }
        else {
          iVar6 = strcmp("--ipv4",pcVar13);
          if (iVar6 == 0) {
            ipv_inuse = "IPv4";
            use_ipv6 = 0;
          }
          else {
            iVar6 = strcmp("--ipv6",pcVar13);
            if (iVar6 != 0) {
              iVar6 = strcmp("--port",pcVar13);
              if (iVar6 == 0) {
                iVar6 = iVar8 + 1;
                if (iVar6 < argc) {
                  uStack_24c58 = strtoul(argv[iVar6],&endptr,10);
                  pcVar26 = endptr;
                  pcVar13 = argv[iVar6];
                  sVar21 = strlen(pcVar13);
                  if (0xfbfe < uStack_24c58 - 0x401 || pcVar26 != pcVar13 + sVar21) {
                    curl_mfprintf(_stderr,"rtspd: invalid --port argument (%s)\n",pcVar13);
                    return 0;
                  }
                  uStack_24c82 = curlx_ultous(uStack_24c58);
                  iVar6 = iVar8 + 2;
                }
              }
              else {
                iVar6 = strcmp("--srcdir",pcVar13);
                if (iVar6 != 0) {
                  puts(
                      "Usage: rtspd [option]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --port [port]\n --srcdir [path]"
                      );
                  return 0;
                }
                iVar6 = iVar8 + 1;
                if (iVar6 < argc) {
                  path = argv[iVar6];
                  iVar6 = iVar8 + 2;
                }
              }
              goto LAB_00105230;
            }
            ipv_inuse = "IPv6";
            use_ipv6 = 1;
          }
          iVar6 = iVar8 + 1;
        }
      }
LAB_00105230:
      iVar8 = iVar6;
    } while (iVar8 < argc);
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    logmsg("cannot install SIGHUP handler: %s",pcVar13);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    logmsg("cannot install SIGPIPE handler: %s",pcVar13);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    logmsg("cannot install SIGALRM handler: %s",pcVar13);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    logmsg("cannot install SIGINT handler: %s",pcVar13);
  }
  else {
    siginterrupt(2,1);
  }
  old_sigterm_handler = (SIGHANDLER_T)signal(0xf,exit_signal_handler);
  if (old_sigterm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    logmsg("cannot install SIGTERM handler: %s",pcVar13);
  }
  else {
    siginterrupt(0xf,1);
  }
  _Var7 = getpid();
  iVar8 = socket((uint)use_ipv6 * 8 + 2,1,0);
  if (iVar8 == -1) {
    puVar14 = (uint *)__errno_location();
    uVar10 = *puVar14;
    pcVar13 = strerror(uVar10);
    pcVar26 = "Error creating socket: (%d) %s";
LAB_001054c6:
    logmsg(pcVar26,(ulong)uVar10,pcVar13);
LAB_001054d2:
    bVar30 = true;
  }
  else {
    flag = 1;
    iVar6 = setsockopt(iVar8,1,2,&flag,4);
    if (iVar6 != 0) {
      puVar14 = (uint *)__errno_location();
      uVar10 = *puVar14;
      pcVar13 = strerror(uVar10);
      pcVar26 = "setsockopt(SO_REUSEADDR) failed with error: (%d) %s";
      goto LAB_001054c6;
    }
    if (use_ipv6 == 0) {
      sStack_24af8.sa_data[6] = '\0';
      sStack_24af8.sa_data[7] = '\0';
      sStack_24af8.sa_data[8] = '\0';
      sStack_24af8.sa_data[9] = '\0';
      sStack_24af8.sa_data[10] = '\0';
      sStack_24af8.sa_data[0xb] = '\0';
      sStack_24af8.sa_data[0xc] = '\0';
      sStack_24af8.sa_data[0xd] = '\0';
      sStack_24af8.sa_family = 2;
      __len = 0x10;
    }
    else {
      uStack_24ae0 = 0;
      sStack_24af8.sa_family = 10;
      sStack_24af8.sa_data._6_4_ = SUB84(_in6addr_any,0);
      sStack_24af8.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_24ae8 = (undefined4)_poll;
      uStack_24ae4 = (undefined4)((ulong)_poll >> 0x20);
      __len = 0x1c;
    }
    sStack_24af8.sa_data._0_2_ = uStack_24c82 << 8 | uStack_24c82 >> 8;
    sStack_24af8.sa_data._2_4_ = 0;
    iVar6 = bind(iVar8,&sStack_24af8,__len);
    if (iVar6 != 0) {
      puVar14 = (uint *)__errno_location();
      uVar10 = *puVar14;
      pcVar13 = strerror(uVar10);
      logmsg("Error binding socket on port %hu: (%d) %s",(ulong)uStack_24c82,(ulong)uVar10,pcVar13);
      goto LAB_001054d2;
    }
    logmsg("Running %s version on port %d",ipv_inuse,(ulong)uStack_24c82);
    iVar6 = listen(iVar8,5);
    if (iVar6 != 0) {
      puVar14 = (uint *)__errno_location();
      uVar10 = *puVar14;
      pcVar13 = strerror(uVar10);
      pcVar26 = "listen() failed with error: (%d) %s";
      goto LAB_001054c6;
    }
    iVar9 = write_pidfile(pcStack_24c20);
    iVar6 = -1;
    _Var11 = _Var7;
    iVar4 = iVar8;
    if (iVar9 == 0) {
      bVar30 = true;
      goto LAB_001054da;
    }
    do {
      iStack_24c34 = iVar4;
      _Stack_24c48 = _Var11;
      bVar30 = false;
      iVar6 = accept(iVar8,(sockaddr *)0x0,(socklen_t *)0x0);
      if (got_exit_signal != 0) goto LAB_001054da;
      if (iVar6 == -1) {
        puVar14 = (uint *)__errno_location();
        uVar10 = *puVar14;
        pcVar13 = strerror(uVar10);
        bVar30 = false;
        logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",(ulong)uVar10,pcVar13);
        break;
      }
      set_advisor_read_lock("log/serverlogs.lock");
      serverlogslocked = '\x01';
      logmsg("====> Client connect");
      flag = 1;
      iVar8 = setsockopt(iVar6,6,1,&flag,4);
      if (iVar8 == -1) {
        logmsg("====> TCP_NODELAY failed");
      }
      bStack_48 = 0;
      uStack_24c58 = CONCAT44(uStack_24c58._4_4_,iVar6);
      do {
        bVar2 = bStack_48;
        uVar24 = uStack_88;
        pcVar13 = local_90;
        if (got_exit_signal != 0) break;
        pcStack_24c28 = (char *)((long)&uStack_24a80 + (long)local_90);
        if (bStack_48 == 0) {
          pcStack_24c28 = (char *)0x0;
        }
        local_90 = (char *)0x0;
        uStack_88 = 0;
        local_80 = 0xfffffffffffffff9;
        local_78 = (undefined1 *)0x0;
        local_70 = 1;
        local_6e = '\0';
        local_68 = (undefined1 *)0x0;
        local_60 = 0;
        iStack_4c = 0;
        bStack_48 = 0;
        local_5c = 0;
        iStack_54 = 0;
        iStack_50 = 0;
        local_40 = (undefined1 *)0x0;
        sStack_38 = 0;
        uStack_24c08 = 0;
        sVar18 = uVar24 - (long)pcVar13;
        if (bVar2 == 0) {
          sVar18 = 0;
        }
        do {
          if ((sVar18 != 0 & bVar2) == 1) {
            memmove(&uStack_24a80,pcStack_24c28,sVar18);
            sVar15 = curlx_uztosz(sVar18);
            sVar18 = 0;
          }
          else {
            puVar25 = local_68;
            if (local_5c._4_4_ == 0) {
              puVar25 = (undefined1 *)(149999 - uStack_88);
            }
            sVar15 = recv(iVar6,(void *)((long)&uStack_24a80 + uStack_88),(size_t)puVar25,0);
          }
          if (got_exit_signal != 0) goto LAB_0010708f;
          if (sVar15 == 0) {
            logmsg("Connection closed by client");
LAB_0010706f:
            *(undefined1 *)((long)&uStack_24a80 + uStack_88) = 0;
            storerequest((char *)&uStack_24a80,uStack_88);
            goto LAB_0010708f;
          }
          if (sVar15 < 0) {
            puVar14 = (uint *)__errno_location();
            uVar10 = *puVar14;
            pcVar13 = strerror(uVar10);
            logmsg("recv() returned error: (%d) %s",(ulong)uVar10,pcVar13);
            goto LAB_0010706f;
          }
          logmsg("Read %zd bytes",sVar15);
          uStack_88 = sVar15 + uStack_88;
          *(undefined1 *)((long)&uStack_24a80 + uStack_88) = 0;
          pcVar13 = local_90 + (long)&uStack_24a80;
          pcVar26 = strstr(pcVar13,"\r\n\r\n");
          logmsg("ProcessRequest() called with testno %ld and line [%s]",local_80,pcVar13);
          uVar24 = local_80;
          if ((local_80 == 0xfffffffffffffff9) &&
             (iVar8 = __isoc99_sscanf(pcVar13,"%255s %139999s %4s/%d.%d",ProcessRequest_request,
                                      &ProcessRequest_doc,&ProcessRequest_prot_str,&prot_major,
                                      &prot_minor), uVar24 = local_80, iVar8 == 5)) {
            if (DAT_0012ea14 == '\0' && ProcessRequest_prot_str == 0x50545448) {
              iStack_50 = 2;
LAB_00105a24:
              uVar27 = _prot_major & 0xffffffff;
              uVar24 = (ulong)(uint)prot_minor;
              iStack_4c = prot_minor + prot_major * 10;
              __s2 = (byte *)strrchr((char *)&ProcessRequest_doc,0x2f);
              count = (size_t)__s2;
              if (__s2 == (byte *)0x0) {
                iVar8 = __isoc99_sscanf(&uStack_24a80,"CONNECT %139999s HTTP/%d.%d",
                                        &ProcessRequest_doc,&prot_major,&prot_minor);
                _Var7 = _Stack_24c48;
                if (iVar8 == 3) {
                  curl_msnprintf((char *)&endptr,0x100,"Received a CONNECT %s HTTP/%d.%d request",
                                 &ProcessRequest_doc,_prot_major & 0xffffffff,
                                 (ulong)(uint)prot_minor);
                  logmsg("%s");
                  if (iStack_4c == 10) {
                    local_70 = local_70 & 0xff00;
                  }
                  if (((ushort)((uint)ProcessRequest_doc >> 0x10) & 0xff) == 100 &&
                      (short)ProcessRequest_doc == 0x6162) {
                    uVar24 = 0xfffffffffffffffb;
                  }
                  else {
                    uVar24 = 0xfffffffffffffffd;
                    if ((((ProcessRequest_doc == 0x74736574) &&
                         (pcVar20 = strchr((char *)&ProcessRequest_doc,0x3a), pcVar20 != (char *)0x0
                         )) && (pcVar20[1] != 0)) &&
                       (iVar8 = Curl_isdigit((uint)(byte)pcVar20[1]), iVar8 != 0)) {
                      uVar24 = strtol(pcVar20 + 1,(char **)0x0,10);
                    }
                  }
                }
                else {
                  logmsg("Did not find test number in PATH");
                  uVar24 = 0xffffffffffffffff;
                }
                goto LAB_00105e66;
              }
              sVar21 = strlen((char *)&ProcessRequest_doc);
              sVar16 = strlen(ProcessRequest_request);
              if (sVar16 + sVar21 < 200) {
                curl_msnprintf((char *)&endptr,0x100,"Got request: %s %s %s/%d.%d",
                               ProcessRequest_request,&ProcessRequest_doc,&ProcessRequest_prot_str,
                               uVar27,uVar24);
              }
              else {
                curl_msnprintf((char *)&endptr,0x100,"Got a *HUGE* request %s/%d.%d",
                               &ProcessRequest_prot_str,uVar27,uVar24);
              }
              logmsg("%s",&endptr);
              iVar8 = strncmp("/verifiedserver",(char *)__s2,0xf);
              _Var7 = _Stack_24c48;
              if (iVar8 == 0) {
                logmsg("Are-we-friendly question received");
                local_80 = 0xfffffffffffffffe;
              }
              else {
                iVar8 = strncmp("/quit",(char *)__s2,5);
                if (iVar8 == 0) {
                  logmsg("Request-to-quit received");
                  local_80 = 0xfffffffffffffffa;
                }
                else {
                  do {
                    __s2 = __s2 + 1;
                    if (*__s2 == 0) break;
                    iVar8 = Curl_isdigit((uint)*__s2);
                  } while (iVar8 == 0);
                  count = (size_t)__s2;
                  local_80 = strtol((char *)__s2,(char **)&count,10);
                  if ((long)local_80 < 0x2711) {
                    local_78 = (undefined1 *)0x0;
                  }
                  else {
                    local_78 = (undefined1 *)(local_80 % 10000);
                    local_80 = local_80 / 10000;
                  }
                  curl_msnprintf((char *)&endptr,0x100,"Requested test number %ld part %ld",local_80
                                 ,local_78);
                  logmsg("%s",&endptr);
                  pcVar20 = test2file(local_80);
                  pFVar19 = fopen64(pcVar20,"rb");
                  if (pFVar19 == (FILE *)0x0) {
                    puVar14 = (uint *)__errno_location();
                    uVar10 = *puVar14;
                    pcVar13 = strerror(uVar10);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar10,pcVar13);
                    logmsg("Error opening file: %s",pcVar20);
                    logmsg("Couldn\'t open test file %ld");
                    local_70 = local_70 & 0xff00;
                  }
                  else {
                    cmd = (char *)0x0;
                    cmdsize = 0;
                    num = 0;
                    rtp_channel = 0;
                    rtp_size = 0;
                    rtp_partno = -1;
                    iVar8 = getpart(&cmd,&cmdsize,"reply","servercmd",(FILE *)pFVar19);
                    fclose(pFVar19);
                    pcVar20 = cmd;
                    if (iVar8 == 0) {
                      count = (size_t)cmd;
                      if (cmdsize != 0) {
                        iStack_24c14 = iVar8;
                        logmsg("Found a reply-servercmd section!");
                        do {
                          iVar8 = strncmp("auth_required",pcVar20,0xd);
                          if (iVar8 == 0) {
                            logmsg("instructed to require authorization header");
                            local_70 = CONCAT11(1,(char)local_70);
                          }
                          else {
                            iVar8 = strncmp("idle",pcVar20,4);
                            if (iVar8 == 0) {
                              logmsg("instructed to idle");
                              iStack_54 = 1;
                              local_70 = CONCAT11(local_70._1_1_,1);
                            }
                            else {
                              iVar8 = strncmp("stream",pcVar20,6);
                              if (iVar8 == 0) {
                                logmsg("instructed to stream");
                                iStack_54 = 2;
                              }
                              else {
                                iVar8 = __isoc99_sscanf(pcVar20,"pipe: %d",&num);
                                if (iVar8 == 1) {
                                  logmsg("instructed to allow a pipe size of %d",(ulong)(uint)num);
                                  if (num < 0) {
                                    logmsg("negative pipe size ignored");
                                  }
                                  else if (num != 0) {
                                    local_5c = CONCAT44(local_5c._4_4_,num + -1);
                                  }
                                }
                                else {
                                  iVar8 = __isoc99_sscanf(pcVar20,"skip: %d",&num);
                                  if (iVar8 == 1) {
                                    logmsg("instructed to skip this number of bytes %d",
                                           (ulong)(uint)num);
                                    local_5c = CONCAT44(num,(int)local_5c);
                                  }
                                  else {
                                    iVar8 = __isoc99_sscanf(pcVar20,
                                                  "rtp: part %d channel %d size %d",&rtp_partno,
                                                  &rtp_channel,&rtp_size);
                                    if (iVar8 == 3) {
                                      if (local_78 == (undefined1 *)(long)rtp_partno) {
                                        logmsg("RTP: part %d channel %d size %d",
                                               (undefined1 *)(long)rtp_partno,
                                               (ulong)(uint)rtp_channel,(ulong)(uint)rtp_size);
                                        uStack_24c00 = (ulong)rtp_size;
                                        puVar25 = (undefined1 *)malloc(uStack_24c00 + 0x10);
                                        *puVar25 = 0x24;
                                        puVar25[1] = (undefined1)rtp_channel;
                                        puVar25[2] = (char)(uStack_24c00 >> 8);
                                        puVar25[3] = (char)uStack_24c00;
                                        if (0 < (long)uStack_24c00) {
                                          uVar24 = 0;
                                          do {
                                            *(undefined8 *)(puVar25 + uVar24 + 4) = 0xa343332315f24;
                                            *(undefined4 *)(puVar25 + uVar24 + 0xc) = 0x66647361;
                                            uVar24 = uVar24 + 0xc;
                                          } while (uVar24 < uStack_24c00);
                                        }
                                        if (local_40 == (undefined1 *)0x0) {
                                          sStack_38 = (size_t)((int)uStack_24c00 + 4);
                                          local_40 = puVar25;
                                        }
                                        else {
                                          puStack_24c10 = puVar25;
                                          local_40 = (undefined1 *)
                                                     realloc(local_40,uStack_24c00 + sStack_38 + 4);
                                          sVar3 = sStack_38;
                                          lVar28 = (long)rtp_size;
                                          memcpy(local_40 + sStack_38,puStack_24c10,lVar28 + 4);
                                          _Var7 = _Stack_24c48;
                                          sStack_38 = sVar3 + lVar28 + 4;
                                          free(puStack_24c10);
                                        }
                                        logmsg("rtp_buffersize is %zu, rtp_size is %d.",sStack_38,
                                               (ulong)(uint)rtp_size);
                                      }
                                    }
                                    else {
                                      logmsg("funny instruction found: %s",pcVar20);
                                    }
                                  }
                                }
                              }
                            }
                          }
                          pcVar17 = strchr(pcVar20,10);
                          pcVar20 = pcVar17 + 1;
                          if (pcVar17 == (char *)0x0) {
                            pcVar20 = (char *)0x0;
                            break;
                          }
                        } while (*pcVar20 != '\0');
                        count = (size_t)pcVar20;
                        logmsg("Done parsing server commands");
                        iVar8 = iStack_24c14;
                      }
                      free(cmd);
                    }
                    else {
                      logmsg("getpart() failed with error: %d");
                      local_70 = local_70 & 0xff00;
                    }
                    uVar24 = local_80;
                    if (iVar8 == 0) goto LAB_00105e66;
                  }
                }
              }
            }
            else {
              if (DAT_0012ea14 == '\0' && ProcessRequest_prot_str == 0x50535452) {
                iStack_50 = 1;
                goto LAB_00105a24;
              }
              iStack_50 = 0;
              logmsg("got unknown protocol %s");
            }
            bVar29 = true;
          }
          else {
LAB_00105e66:
            local_80 = uVar24;
            if (pcVar26 == (char *)0x0) {
              bVar29 = false;
              logmsg("ProcessRequest returned without a complete request");
            }
            else {
              logmsg("ProcessRequest found a complete request");
              if ((int)local_5c != 0) {
                local_90 = local_90 + (long)(pcVar26 + (4 - (long)pcVar13));
              }
              bVar30 = false;
LAB_00105ea6:
              bVar29 = true;
              if (got_exit_signal != 0) goto LAB_0010666a;
              if ((local_68 != (undefined1 *)0x0) ||
                 (iVar8 = Curl_strncasecompare("Content-Length:",pcVar13,0xf), iVar8 == 0)) {
                iVar8 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar13,0x1a);
                if (iVar8 != 0) {
                  bVar30 = true;
                }
                if (!bVar30) goto code_r0x00105f07;
                pcVar13 = strstr((char *)&uStack_24a80,"\r\n0\r\n\r\n");
                bVar29 = pcVar13 != (char *)0x0;
                goto LAB_0010666a;
              }
              bVar5 = pcVar13[0xf];
              pcVar13 = pcVar13 + 0xf;
              while ((bVar5 != 0 && (iVar8 = Curl_isspace((uint)bVar5), iVar8 != 0))) {
                bVar5 = pcVar13[1];
                pcVar13 = pcVar13 + 1;
              }
              endptr = pcVar13;
              piVar12 = __errno_location();
              *piVar12 = 0;
              uVar24 = strtoul(pcVar13,&endptr,10);
              if (((pcVar13 != endptr) && (iVar8 = Curl_isspace((uint)(byte)*endptr), iVar8 != 0))
                 && (*piVar12 != 0x22)) {
                local_68 = (undefined1 *)(uVar24 - (long)local_5c._4_4_);
                logmsg("Found Content-Length: %lu in the request",uVar24);
                if (local_5c._4_4_ != 0) {
                  logmsg("... but will abort after %zu bytes",local_68);
                }
LAB_00105f21:
                if ((local_6e == '\0') &&
                   (pcVar13 = strstr((char *)&uStack_24a80,"Authorization:"), pcVar13 != (char *)0x0
                   )) {
                  local_6e = '\x01';
                  if (local_70._1_1_ == '\x01') {
                    logmsg("Authorization header found, as required");
                  }
                }
                if (((char)local_60 == '\0') &&
                   (pcVar13 = strstr((char *)&uStack_24a80,"Authorization: Digest"),
                   pcVar13 != (char *)0x0)) {
                  local_60 = CONCAT11(local_60._1_1_,1);
                  pcVar13 = "Received Digest request, sending back data %ld";
                  puVar25 = local_78 + 1000;
                  local_78 = local_78 + 1000;
                  goto LAB_0010615e;
                }
                if (local_60._1_1_ == '\0') {
                  pcVar13 = strstr((char *)&uStack_24a80,"Authorization: NTLM TlRMTVNTUAAD");
                  if (pcVar13 == (char *)0x0) {
                    pcVar13 = strstr((char *)&uStack_24a80,"Authorization: NTLM TlRMTVNTUAAB");
                    if (pcVar13 == (char *)0x0) goto LAB_00105fe7;
                    puVar25 = local_78 + 0x3e9;
                    local_60 = CONCAT11(1,(char)local_60);
                    pcVar13 = "Received NTLM type-1, sending back data %ld";
                    local_78 = puVar25;
                  }
                  else {
                    local_78 = local_78 + 0x3ea;
                    local_60 = CONCAT11(1,(char)local_60);
                    logmsg("Received NTLM type-3, sending back data %ld");
                    if (local_68 == (undefined1 *)0x0) goto LAB_00106165;
                    pcVar13 = "  Expecting %zu POSTed bytes";
                    puVar25 = local_68;
                  }
LAB_0010615e:
                  logmsg(pcVar13,puVar25);
                }
                else {
LAB_00105fe7:
                  puVar1 = local_78;
                  if ((999 < (long)local_78) &&
                     (pcVar13 = strstr((char *)&uStack_24a80,"Authorization: Basic"),
                     pcVar13 != (char *)0x0)) {
                    pcVar13 = "Received Basic request, sending back data %ld";
                    puVar25 = puVar1 + 1;
                    local_78 = puVar1 + 1;
                    goto LAB_0010615e;
                  }
                }
LAB_00106165:
                pcVar13 = strstr((char *)&uStack_24a80,"Connection: close");
                if (pcVar13 != (char *)0x0) {
                  local_70 = local_70 & 0xff00;
                }
                iVar8 = (int)local_5c;
                if ((int)local_5c == 0) {
                  if (((((char)local_70 == '\x01') && (10 < iStack_4c)) &&
                      (pcVar26 + 4 < (char *)((long)&uStack_24a80 + uStack_88))) &&
                     ((uStack_24a80._2_1_ == 'T' && (short)uStack_24a80 == 0x4547 ||
                      (uStack_24a80 == 0x44414548)))) {
                    local_90 = pcVar26 + (4 - (long)&uStack_24a80);
                    bStack_48 = 1;
                  }
                }
                else {
                  do {
                    pcVar13 = local_90;
                    iVar8 = iVar8 + -1;
                    if (got_exit_signal != 0) goto LAB_0010666a;
                    pcVar20 = (char *)((long)&uStack_24a80 + (long)local_90);
                    pcVar26 = strstr(pcVar20,"\r\n\r\n");
                    if (pcVar26 == (char *)0x0) {
                      pcVar26 = (char *)0x0;
                      break;
                    }
                    local_90 = pcVar26 + (long)(pcVar13 + (4 - (long)pcVar20));
                    local_5c = CONCAT44(local_5c._4_4_,iVar8);
                  } while (iVar8 != 0);
                }
                if (((local_70._1_1_ != '\x01') || (local_6e == '\x01')) &&
                   (local_68 != (undefined1 *)0x0)) {
                  bVar29 = local_68 <= auStack_24a84 + (uStack_88 - (long)pcVar26);
                }
                goto LAB_0010666a;
              }
              logmsg("Found invalid Content-Length: (%s) in the request");
              local_70 = local_70 & 0xff00;
            }
          }
LAB_0010666a:
          iVar6 = (int)uStack_24c58;
          if (got_exit_signal != 0) goto LAB_0010708f;
          bVar30 = false;
          if ((bVar29) && (bVar30 = bVar29, (int)local_5c != 0)) {
            bVar30 = false;
            logmsg("Waiting for another piped request");
            local_5c = CONCAT44(local_5c._4_4_,(int)local_5c + -1);
          }
        } while ((!bVar30) && (uStack_88 < 149999));
        if (uStack_88 == 149999 && uStack_24c08 < 149999) {
          pcVar13 = "Request would overflow buffer, closing connection";
LAB_001066ff:
          pcVar26 = (char *)0x0;
          logmsg(pcVar13);
          puVar25 = &local_91;
        }
        else {
          if (149999 < uStack_88) {
            pcVar13 = "Request buffer overflow, closing connection";
            goto LAB_001066ff;
          }
          puVar25 = (undefined1 *)((long)&uStack_24a80 + uStack_88);
          pcVar26 = (char *)0x1;
        }
        *puVar25 = 0;
        storerequest((char *)&uStack_24a80,(size_t)(&local_90)[bStack_48 ^ 1]);
        if (((char)pcVar26 == '\0') || (got_exit_signal != 0)) break;
        if (prevbounce == '\x01') {
          if ((local_80 == prevtestno) && (local_78 == (undefined1 *)prevpartno)) {
            local_78 = local_78 + 1;
            logmsg("BOUNCE part number to %ld");
          }
          else {
            prevbounce = '\0';
            prevtestno = -1;
            prevpartno = -1;
          }
        }
        cmd = (char *)0x0;
        cmdsize = 0;
        _prot_major = 0;
        logmsg("Send response number %ld part %ld",local_80,local_78);
        if (iStack_54 != 1) {
          if (iStack_54 == 2) {
            count = 0x1f;
            do {
              sVar18 = send(iVar6,"a string to stream 01234567890\n",count,0x4000);
              if (got_exit_signal != 0) goto LAB_00106ac4;
            } while (sVar18 == count);
            logmsg("Stopped streaming");
            goto LAB_00106ac4;
          }
          local_70 = local_70 & 0xff00;
          if ((long)local_80 < 0) {
            switch(local_80) {
            default:
              logmsg("Replying to with a 404");
              pcVar26 = "RTSP/1.0 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\n\r\n";
              if (iStack_50 == 2) {
                pcVar26 = 
                "HTTP/1.1 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite RTSP server/0.1</ADDRESS>\n</BODY></HTML>\n"
                ;
              }
              break;
            case 0xfffffffffffffffa:
              logmsg("Replying to QUIT");
              pcVar26 = "HTTP/1.1 200 Goodbye\r\n\r\n";
              break;
            case 0xfffffffffffffffb:
              logmsg("Replying to a bad CONNECT");
              pcVar26 = "HTTP/1.1 501 Forbidden you fool\r\n\r\n";
              break;
            case 0xfffffffffffffffc:
              bVar30 = false;
              logmsg("Bailing out due to internal error");
              goto LAB_00106a9b;
            case 0xfffffffffffffffd:
              logmsg("Replying to CONNECT");
              pcVar26 = "HTTP/1.1 200 Mighty fine indeed\r\n\r\n";
              break;
            case 0xfffffffffffffffe:
              logmsg("Identifying ourselves as friends");
              _Var11 = getpid();
              curl_msnprintf((char *)&endptr,0x40,"RTSP_SERVER WE ROOLZ: %ld\r\n",(long)_Var11);
              sVar21 = strlen((char *)&endptr);
              curl_msnprintf(send_doc_weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s"
                             ,sVar21,&endptr);
              pcVar26 = send_doc_weare;
            }
            count = strlen(pcVar26);
            bVar30 = true;
LAB_00106a9b:
            uVar24 = 0;
            iVar6 = (int)uStack_24c58;
          }
          else {
            pcVar13 = test2file(local_80);
            uStack_24bf0 = 0;
            uStack_24bb8 = 0;
            uStack_24bb0 = 0;
            uStack_24bc8 = 0;
            uStack_24bc0 = 0;
            uStack_24bd8 = 0;
            uStack_24bd0 = 0;
            uStack_24be8 = 0;
            uStack_24be0 = 0;
            endptr = (char *)0x61746164;
            if (local_78 != (undefined1 *)0x0) {
              curl_msnprintf((char *)&endptr,0x50,"data%ld");
            }
            pFVar19 = fopen64(pcVar13,"rb");
            if (pFVar19 == (FILE *)0x0) {
              puVar14 = (uint *)__errno_location();
              uVar10 = *puVar14;
              uVar24 = (ulong)uVar10;
              pcVar13 = strerror(uVar10);
              bVar30 = false;
              logmsg("fopen() failed with error: %d %s",(ulong)uVar10,pcVar13);
              logmsg("Error opening file: %s");
              logmsg("Couldn\'t open test file");
            }
            else {
              uVar10 = getpart(&cmd,&count,"reply",(char *)&endptr,(FILE *)pFVar19);
              uVar24 = (ulong)uVar10;
              fclose(pFVar19);
              pcVar26 = cmd;
              if (uVar10 == 0) {
                if (got_exit_signal == 0) {
                  pFVar19 = fopen64(pcVar13,"rb");
                  if (pFVar19 == (FILE *)0x0) {
                    puVar14 = (uint *)__errno_location();
                    uVar10 = *puVar14;
                    pcVar13 = strerror(uVar10);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar10,pcVar13);
                    logmsg("Error opening file: %s");
                    logmsg("Couldn\'t open test file");
                  }
                  else {
                    uVar10 = getpart((char **)&cmdsize,(size_t *)&prot_major,"reply","postcmd",
                                     (FILE *)pFVar19);
                    fclose(pFVar19);
                    if (uVar10 == 0) {
                      bVar30 = true;
                      uVar24 = 0;
                      goto LAB_00106995;
                    }
                    logmsg("getpart() failed with error: %d");
                  }
                  uVar24 = (ulong)uVar10;
                  bVar30 = false;
                  free(cmd);
                }
                else {
                  free(cmd);
                  uVar24 = 0;
                  bVar30 = false;
                }
              }
              else {
                bVar30 = false;
                logmsg("getpart() failed with error: %d");
                pcVar26 = (char *)pFVar19;
              }
            }
LAB_00106995:
            iVar6 = (int)uStack_24c58;
          }
          if (bVar30) {
            if (got_exit_signal == 0) {
              pcVar13 = strstr(pcVar26,"swsclose");
              bVar30 = count != 0;
              if (!bVar30 || pcVar13 != (char *)0x0) {
                logmsg("connection close instruction \"swsclose\" found in response");
              }
              pcVar20 = strstr(pcVar26,"swsbounce");
              if (pcVar20 == (char *)0x0) {
                prevbounce = '\0';
              }
              else {
                prevbounce = '\x01';
                logmsg("enable \"swsbounce\" in the next request");
              }
              pFVar19 = fopen64("log/server.response","ab");
              if (pFVar19 == (FILE *)0x0) {
                puVar14 = (uint *)__errno_location();
                uVar10 = *puVar14;
                pcVar13 = strerror(uVar10);
                logmsg("fopen() failed with error: %d %s",(ulong)uVar10,pcVar13);
                logmsg("Error opening file: %s");
                logmsg("couldn\'t create logfile: log/server.response");
                free(cmd);
                free((void *)cmdsize);
                iVar6 = (int)uStack_24c58;
                goto LAB_00106ac4;
              }
              pcStack_24c28 = (char *)count;
              bVar29 = false;
              do {
                sVar18 = count;
                if (199 < count) {
                  sVar18 = 200;
                }
                sVar21 = send((int)uStack_24c58,pcVar26,sVar18,0x4000);
                bVar31 = true;
                if ((long)sVar21 < 0) {
                  bVar29 = true;
                }
                else {
                  logmsg("Sent off %zd bytes",sVar21);
                  fwrite(pcVar26,1,sVar21,pFVar19);
                  if (got_exit_signal == 0) {
                    count = count - sVar21;
                    pcVar26 = (char *)((long)&((FILE *)pcVar26)->_flags + sVar21);
                    bVar31 = false;
                  }
                }
              } while ((!bVar31) && (count != 0));
              if (local_40 != (undefined1 *)0x0) {
                logmsg("About to write %zu RTP bytes",sStack_38);
                count = sStack_38;
                do {
                  sVar21 = 200;
                  if (count < 200) {
                    sVar21 = count;
                  }
                  sVar22 = send((int)uStack_24c58,local_40 + (sStack_38 - count),sVar21,0x4000);
                  if (sVar22 < 0) {
                    bVar29 = true;
                    break;
                  }
                  count = count - sVar22;
                } while (count != 0);
                free(local_40);
                sStack_38 = 0;
              }
              iVar8 = fclose(pFVar19);
              _Var7 = _Stack_24c48;
              bVar31 = iVar8 == 0;
              if (!bVar31) {
                puVar14 = (uint *)__errno_location();
                uVar24 = (ulong)*puVar14;
                if (*puVar14 == 4) {
                  do {
                    iVar8 = fclose(pFVar19);
                    bVar31 = iVar8 == 0;
                    if (bVar31) {
                      uVar24 = 4;
                      break;
                    }
                    uVar24 = (ulong)*puVar14;
                  } while (*puVar14 == 4);
                }
                else {
                  bVar31 = false;
                }
              }
              if (!bVar31) {
                pcVar26 = strerror((int)uVar24);
                logmsg("Error closing file %s error: %d %s","log/server.response",uVar24,pcVar26);
              }
              iVar6 = (int)uStack_24c58;
              if (got_exit_signal == 0) {
                if (!bVar29) {
                  logmsg("Response sent (%zu bytes) and written to log/server.response");
                  free(cmd);
                  if (_prot_major != 0) {
                    cmd = (char *)cmdsize;
                    do {
                      iVar8 = __isoc99_sscanf(cmd,"%31s %d",&endptr,&prot_minor);
                      if (iVar8 == 2) {
                        if (endptr._4_1_ == '\0' && (int)endptr == 0x74696177) {
                          logmsg("Told to sleep for %d seconds",(ulong)(uint)prot_minor);
                          uVar23 = prot_minor << 2;
                          uVar10 = (int)uVar23 >> 0x1f & uVar23;
                          do {
                            if ((int)uVar23 < 1) goto LAB_00106fa8;
                            iVar8 = wait_ms(0xfa);
                            if (got_exit_signal != 0) {
                              uVar10 = uVar23 - 1;
                              goto LAB_00106fa8;
                            }
                            uVar23 = uVar23 - 1;
                          } while (iVar8 == 0);
                          puVar14 = (uint *)__errno_location();
                          uVar10 = *puVar14;
                          pcVar26 = strerror(uVar10);
                          logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar10,pcVar26);
                          uVar10 = uVar23;
LAB_00106fa8:
                          if (uVar10 == 0) {
                            logmsg("Continuing after sleeping %d seconds",(ulong)(uint)prot_minor);
                          }
                        }
                        else {
                          logmsg("Unknown command in reply command section");
                        }
                      }
                      pcVar26 = strchr(cmd,10);
                      cmd = pcVar26 + 1;
                      if (pcVar26 == (char *)0x0) {
                        cmd = (char *)0x0;
                        break;
                      }
                    } while (*cmd != '\0');
                  }
                  free((void *)cmdsize);
                  local_70 = CONCAT11(local_70._1_1_,bVar30 && pcVar13 == (char *)0x0);
                  prevtestno = local_80;
                  prevpartno = (long)local_78;
                  goto LAB_00106ac4;
                }
                logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent");
              }
            }
            free(cmd);
            free((void *)cmdsize);
          }
        }
LAB_00106ac4:
        if (got_exit_signal != 0) break;
        if (local_80 != 0xfffffffffffffffd && (long)local_80 < 0) {
          pcVar13 = "special request received, no persistency";
LAB_001070f9:
          logmsg(pcVar13);
          break;
        }
        if ((char)local_70 == '\0') {
          pcVar13 = "instructed to close connection after server-reply";
          goto LAB_001070f9;
        }
        logmsg("=> persistent connection request ended, awaits new request");
      } while (((char)local_70 != '\0') || (local_80 == 0xfffffffffffffffd));
LAB_0010708f:
      if (got_exit_signal != 0) {
        bVar30 = false;
        iVar8 = iStack_24c34;
        goto LAB_001054da;
      }
      logmsg("====> Client disconnect");
      close(iVar6);
      iVar8 = iStack_24c34;
      if (serverlogslocked == '\x01') {
        serverlogslocked = '\0';
        clear_advisor_read_lock("log/serverlogs.lock");
      }
      bVar30 = false;
      _Var11 = _Stack_24c48;
      iVar4 = iStack_24c34;
    } while (local_80 != 0xfffffffffffffffa);
  }
  iVar6 = -1;
LAB_001054da:
  if (iVar6 != -1 && iVar6 != iVar8) {
    close(iVar6);
  }
  if (iVar8 != -1) {
    close(iVar8);
  }
  if (got_exit_signal != 0) {
    logmsg("signalled to die");
  }
  if (!bVar30) {
    unlink(pcStack_24c20);
  }
  if (serverlogslocked == '\x01') {
    serverlogslocked = '\0';
    clear_advisor_read_lock("log/serverlogs.lock");
  }
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (old_sigterm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xf,(__sighandler_t)old_sigterm_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",ipv_inuse,
           (ulong)uStack_24c82,(long)_Var7,(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("========> rtspd quits");
  return 0;
code_r0x00105f07:
  pcVar20 = strchr(pcVar13,10);
  pcVar13 = pcVar20 + 1;
  if (pcVar20 == (char *)0x0) goto LAB_00105f21;
  goto LAB_00105ea6;
}

Assistant:

int main(int argc, char *argv[])
{
  srvr_sockaddr_union_t me;
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  int flag;
  unsigned short port = DEFAULT_PORT;
  const char *pidname = ".rtsp.pid";
  struct httprequest req;
  int rc;
  int error;
  int arg = 1;
  long pid;

  memset(&req, 0, sizeof(req));

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("rtspd IPv4%s"
             "\n"
             ,
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv4", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           (ulnum < 1025UL) || (ulnum > 65535UL)) {
          fprintf(stderr, "rtspd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else if(!strcmp("--srcdir", argv[arg])) {
      arg++;
      if(argc>arg) {
        path = argv[arg];
        arg++;
      }
    }
    else {
      puts("Usage: rtspd [option]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --port [port]\n"
           " --srcdir [path]");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

  install_signal_handlers();

  pid = (long)getpid();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  flag = 1;
  if(0 != setsockopt(sock, SOL_SOCKET, SO_REUSEADDR,
            (void *)&flag, sizeof(flag))) {
    error = SOCKERRNO;
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

#ifdef ENABLE_IPV6
  if(!use_ipv6) {
#endif
    memset(&me.sa4, 0, sizeof(me.sa4));
    me.sa4.sin_family = AF_INET;
    me.sa4.sin_addr.s_addr = INADDR_ANY;
    me.sa4.sin_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa4));
#ifdef ENABLE_IPV6
  }
  else {
    memset(&me.sa6, 0, sizeof(me.sa6));
    me.sa6.sin6_family = AF_INET6;
    me.sa6.sin6_addr = in6addr_any;
    me.sa6.sin6_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa6));
  }
#endif /* ENABLE_IPV6 */
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("Error binding socket on port %hu: (%d) %s",
           port, error, strerror(error));
    goto server_cleanup;
  }

  logmsg("Running %s version on port %d", ipv_inuse, (int)port);

  /* start accepting connections */
  rc = listen(sock, 5);
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("listen() failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  /*
  ** As soon as this server writes its pid file the test harness will
  ** attempt to connect to this server and initiate its verification.
  */

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile)
    goto server_cleanup;

  for(;;) {
    msgsock = accept(sock, NULL, NULL);

    if(got_exit_signal)
      break;
    if(CURL_SOCKET_BAD == msgsock) {
      error = SOCKERRNO;
      logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",
             error, strerror(error));
      break;
    }

    /*
    ** As soon as this server acepts a connection from the test harness it
    ** must set the server logs advisor read lock to indicate that server
    ** logs should not be read until this lock is removed by this server.
    */

    set_advisor_read_lock(SERVERLOGS_LOCK);
    serverlogslocked = 1;

    logmsg("====> Client connect");

#ifdef TCP_NODELAY
    /*
     * Disable the Nagle algorithm to make it easier to send out a large
     * response in many small segments to torture the clients more.
     */
    flag = 1;
    if(setsockopt(msgsock, IPPROTO_TCP, TCP_NODELAY,
                   (void *)&flag, sizeof(flag)) == -1) {
      logmsg("====> TCP_NODELAY failed");
    }
#endif

    /* initialization of httprequest struct is done in get_request(), but due
       to pipelining treatment the pipelining struct field must be initialized
       previously to FALSE every time a new connection arrives. */

    req.pipelining = FALSE;

    do {
      if(got_exit_signal)
        break;

      if(get_request(msgsock, &req))
        /* non-zero means error, break out of loop */
        break;

      if(prevbounce) {
        /* bounce treatment requested */
        if((req.testno == prevtestno) &&
           (req.partno == prevpartno)) {
          req.partno++;
          logmsg("BOUNCE part number to %ld", req.partno);
        }
        else {
          prevbounce = FALSE;
          prevtestno = -1;
          prevpartno = -1;
        }
      }

      send_doc(msgsock, &req);
      if(got_exit_signal)
        break;

      if((req.testno < 0) && (req.testno != DOCNUMBER_CONNECT)) {
        logmsg("special request received, no persistency");
        break;
      }
      if(!req.open) {
        logmsg("instructed to close connection after server-reply");
        break;
      }

      if(req.open)
        logmsg("=> persistent connection request ended, awaits new request");
      /* if we got a CONNECT, loop and get another request as well! */
    } while(req.open || (req.testno == DOCNUMBER_CONNECT));

    if(got_exit_signal)
      break;

    logmsg("====> Client disconnect");
    sclose(msgsock);
    msgsock = CURL_SOCKET_BAD;

    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }

    if(req.testno == DOCNUMBER_QUIT)
      break;
  }

server_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(got_exit_signal)
    logmsg("signalled to die");

  if(wrotepidfile)
    unlink(pidname);

  if(serverlogslocked) {
    serverlogslocked = 0;
    clear_advisor_read_lock(SERVERLOGS_LOCK);
  }

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",
           ipv_inuse, (int)port, pid, exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("========> rtspd quits");
  return 0;
}